

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O2

void __thiscall
pbrt::BVHBuildNode::InitInterior(BVHBuildNode *this,int axis,BVHBuildNode *c0,BVHBuildNode *c1)

{
  long in_FS_OFFSET;
  Bounds3<float> local_30;
  
  this->children[0] = c0;
  this->children[1] = c1;
  Union<float>(&local_30,&c0->bounds,&c1->bounds);
  (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y =
       local_30.pMax.super_Tuple3<pbrt::Point3,_float>.y;
  (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z =
       local_30.pMax.super_Tuple3<pbrt::Point3,_float>.z;
  (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x =
       local_30.pMin.super_Tuple3<pbrt::Point3,_float>.x;
  (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
       local_30.pMin.super_Tuple3<pbrt::Point3,_float>.y;
  *(undefined8 *)&(this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = local_30._8_8_;
  this->splitAxis = axis;
  this->nPrimitives = 0;
  *(long *)(in_FS_OFFSET + -0x2d0) = *(long *)(in_FS_OFFSET + -0x2d0) + 1;
  return;
}

Assistant:

void InitInterior(int axis, BVHBuildNode *c0, BVHBuildNode *c1) {
        children[0] = c0;
        children[1] = c1;
        bounds = Union(c0->bounds, c1->bounds);
        splitAxis = axis;
        nPrimitives = 0;
        ++interiorNodes;
    }